

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O1

map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
* __thiscall
capnp::anon_unknown_1::CapnpcCppMain::TemplateContext::getScopeMap
          (map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
           *__return_storage_ptr__,TemplateContext *this)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  Reader params;
  PointerReader local_70;
  ListReader local_50;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  do {
    if ((this->node)._reader.pointerCount < 6) {
      local_70.nestingLimit = 0x7fffffff;
      local_70.capTable = (CapTableReader *)0x0;
      local_70.pointer = (WirePointer *)0x0;
      local_70.segment = (SegmentReader *)0x0;
    }
    else {
      local_70.segment = (this->node)._reader.segment;
      local_70.capTable = (this->node)._reader.capTable;
      local_70.pointer = (this->node)._reader.pointers + 5;
      local_70.nestingLimit = (this->node)._reader.nestingLimit;
    }
    _::PointerReader::getList(&local_50,&local_70,INLINE_COMPOSITE,(word *)0x0);
    if (local_50.elementCount != 0) {
      if ((this->node)._reader.dataSize < 0x40) {
        local_70.segment = (SegmentReader *)0x0;
      }
      else {
        local_70.segment = *(this->node)._reader.data;
      }
      pmVar2 = std::
               map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)&local_70);
      (pmVar2->reader).structDataSize = local_50.structDataSize;
      (pmVar2->reader).structPointerCount = local_50.structPointerCount;
      (pmVar2->reader).elementSize = local_50.elementSize;
      (pmVar2->reader).field_0x27 = local_50._39_1_;
      (pmVar2->reader).nestingLimit = local_50.nestingLimit;
      *(undefined4 *)&(pmVar2->reader).field_0x2c = local_50._44_4_;
      (pmVar2->reader).ptr = local_50.ptr;
      (pmVar2->reader).elementCount = local_50.elementCount;
      (pmVar2->reader).step = local_50.step;
      (pmVar2->reader).segment = local_50.segment;
      (pmVar2->reader).capTable = local_50.capTable;
    }
    this = (this->parent).ptr;
  } while (this != (TemplateContext *)0x0);
  return __return_storage_ptr__;
}

Assistant:

std::map<uint64_t, List<schema::Node::Parameter>::Reader> getScopeMap() const {
      std::map<uint64_t, List<schema::Node::Parameter>::Reader> result;
      const TemplateContext* current = this;
      for (;;) {
        auto params = current->node.getParameters();
        if (params.size() > 0) {
          result[current->node.getId()] = params;
        }
        KJ_IF_MAYBE(p, current->parent) {
          current = p;
        } else {
          return result;
        }
      }
    }